

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

MQTTErrors mqtt_subscribe(mqtt_client *client,char *topic_name,int max_qos_level)

{
  uint16_t uVar1;
  mqtt_queued_message *pmVar2;
  mqtt_queued_message *msg;
  size_t sStack_30;
  uint16_t packet_id;
  ssize_t rv;
  int max_qos_level_local;
  char *topic_name_local;
  mqtt_client *client_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&client->mutex);
  uVar1 = __mqtt_next_pid(client);
  if (client->error < 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
    client_local._4_4_ = client->error;
  }
  else {
    sStack_30 = mqtt_pack_subscribe_request
                          ((client->mq).curr,(client->mq).curr_sz,(uint)uVar1,topic_name,
                           (ulong)(uint)max_qos_level,0);
    if ((long)sStack_30 < 0) {
      client_local._4_4_ = (MQTTErrors)sStack_30;
      client->error = client_local._4_4_;
      pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
    }
    else {
      if (sStack_30 == 0) {
        mqtt_mq_clean(&client->mq);
        sStack_30 = mqtt_pack_subscribe_request
                              ((client->mq).curr,(client->mq).curr_sz,(uint)uVar1,topic_name,
                               (ulong)(uint)max_qos_level,0);
        if ((long)sStack_30 < 0) {
          client->error = (MQTTErrors)sStack_30;
          pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
          return (MQTTErrors)sStack_30;
        }
        if (sStack_30 == 0) {
          client->error = MQTT_ERROR_SEND_BUFFER_IS_FULL;
          pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
          return MQTT_ERROR_SEND_BUFFER_IS_FULL;
        }
      }
      pmVar2 = mqtt_mq_register(&client->mq,sStack_30);
      pmVar2->control_type = MQTT_CONTROL_SUBSCRIBE;
      pmVar2->packet_id = uVar1;
      pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
      client_local._4_4_ = MQTT_OK;
    }
  }
  return client_local._4_4_;
}

Assistant:

enum MQTTErrors mqtt_subscribe(struct mqtt_client *client,
                       const char* topic_name,
                       int max_qos_level)
{
    ssize_t rv;
    uint16_t packet_id;
    struct mqtt_queued_message *msg;
    MQTT_PAL_MUTEX_LOCK(&client->mutex);
    packet_id = __mqtt_next_pid(client);

    /* try to pack the message */
    MQTT_CLIENT_TRY_PACK(
        rv, msg, client, 
        mqtt_pack_subscribe_request(
            client->mq.curr, client->mq.curr_sz,
            packet_id,
            topic_name,
            max_qos_level,
            (const char*)NULL
        ), 
        1
    );
    /* save the control type and packet id of the message */
    msg->control_type = MQTT_CONTROL_SUBSCRIBE;
    msg->packet_id = packet_id;

    MQTT_PAL_MUTEX_UNLOCK(&client->mutex);
    return MQTT_OK;
}